

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

cmd_ln_t * cmd_ln_parse_file_r(ps_config_t *inout_cmdln,ps_arg_t *defn,char *filename,int32 strict)

{
  FILE *__stream;
  char *pcVar1;
  char **ppcVar2;
  bool bVar3;
  char *tmp_str;
  char **tmp_argv;
  undefined1 local_65;
  undefined1 auStack_64 [3];
  char separator [5];
  int rv;
  char **f_argv;
  int ch;
  int quoting;
  int len;
  int arg_max_length;
  char *str;
  int argv_size;
  int argc;
  FILE *file;
  int32 strict_local;
  char *filename_local;
  ps_arg_t *defn_local;
  ps_config_t *inout_cmdln_local;
  
  quoting = 0x200;
  ch = 0;
  _auStack_64 = 0;
  stack0xffffffffffffff97 = 0xa0d0920;
  local_65 = 0;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1b2,"Cannot open configuration file %s for reading\n",filename);
    inout_cmdln_local = (ps_config_t *)0x0;
  }
  else {
    f_argv._0_4_ = fgetc(__stream);
    while( true ) {
      bVar3 = false;
      if ((int)f_argv != -1) {
        pcVar1 = strchr((char *)((long)&tmp_argv + 7),(int)f_argv);
        bVar3 = pcVar1 != (char *)0x0;
      }
      if (!bVar3) break;
      f_argv._0_4_ = fgetc(__stream);
    }
    if ((int)f_argv == -1) {
      fclose(__stream);
      inout_cmdln_local = (ps_config_t *)0x0;
    }
    else {
      str._0_4_ = 0x1e;
      str._4_4_ = 0;
      register0x00000000 =
           (char **)__ckd_calloc__(0x1e,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                   ,0x1c4);
      _len = (char *)__ckd_calloc__(0x201,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                    ,0x1c6);
      f_argv._4_4_ = 0;
      do {
        while( true ) {
          if ((ch == 0) && (str._4_4_ % 2 == 0)) {
            while ((int)f_argv == 0x23) {
              f_argv._0_4_ = fgetc(__stream);
              while ((int)f_argv != -1 && (int)f_argv != 10) {
                f_argv._0_4_ = fgetc(__stream);
              }
              f_argv._0_4_ = fgetc(__stream);
              while( true ) {
                bVar3 = false;
                if ((int)f_argv != -1) {
                  pcVar1 = strchr((char *)((long)&tmp_argv + 7),(int)f_argv);
                  bVar3 = pcVar1 != (char *)0x0;
                }
                if (!bVar3) break;
                f_argv._0_4_ = fgetc(__stream);
              }
            }
            if ((int)f_argv == -1) goto LAB_001151d2;
          }
          if (((int)f_argv != 0x22) && ((int)f_argv != 0x27)) break;
          if (f_argv._4_4_ == (int)f_argv) {
            f_argv._4_4_ = 0;
          }
          else {
            if (f_argv._4_4_ != 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                      ,0x1dd,"Nesting quotations is not supported!\n");
              _auStack_64 = 1;
              goto LAB_001151d2;
            }
            f_argv._4_4_ = (int)f_argv;
          }
LAB_001151ba:
          f_argv._0_4_ = fgetc(__stream);
        }
        if (((int)f_argv != -1) &&
           ((f_argv._4_4_ != 0 ||
            (pcVar1 = strchr((char *)((long)&tmp_argv + 7),(int)f_argv), pcVar1 == (char *)0x0)))) {
          if (quoting <= ch) {
            pcVar1 = (char *)__ckd_realloc__(_len,(long)(quoting * 2 + 1),
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                             ,0x207);
            if (pcVar1 == (char *)0x0) {
              _auStack_64 = 1;
              break;
            }
            quoting = quoting << 1;
            _len = pcVar1;
          }
          _len[ch] = (char)(int)f_argv;
          _len[ch + 1] = '\0';
          ch = ch + 1;
          goto LAB_001151ba;
        }
        if ((int)str <= str._4_4_) {
          ppcVar2 = (char **)__ckd_realloc__(stack0xffffffffffffffa0,(long)((int)str << 1) << 3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                             ,0x1e9);
          if (ppcVar2 == (char **)0x0) {
            _auStack_64 = 1;
            break;
          }
          str._0_4_ = (int)str << 1;
          unique0x10000375 = ppcVar2;
        }
        pcVar1 = __ckd_salloc__(_len,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                ,0x1f2);
        stack0xffffffffffffffa0[str._4_4_] = pcVar1;
        ch = 0;
        *_len = '\0';
        str._4_4_ = str._4_4_ + 1;
        if (f_argv._4_4_ != 0) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x1f8,"Unclosed quotation, having EOF close it...\n");
        }
        while( true ) {
          bVar3 = false;
          if ((int)f_argv != -1) {
            pcVar1 = strchr((char *)((long)&tmp_argv + 7),(int)f_argv);
            bVar3 = pcVar1 != (char *)0x0;
          }
          if (!bVar3) break;
          f_argv._0_4_ = fgetc(__stream);
        }
      } while ((int)f_argv != -1);
LAB_001151d2:
      fclose(__stream);
      ckd_free(_len);
      if (_auStack_64 == 0) {
        inout_cmdln_local = parse_options(inout_cmdln,defn,str._4_4_,stack0xffffffffffffffa0,strict)
        ;
      }
      else {
        for (f_argv._0_4_ = 0; (int)f_argv < str._4_4_; f_argv._0_4_ = (int)f_argv + 1) {
          ckd_free(stack0xffffffffffffffa0[(int)f_argv]);
        }
        ckd_free(stack0xffffffffffffffa0);
        inout_cmdln_local = (ps_config_t *)0x0;
      }
    }
  }
  return inout_cmdln_local;
}

Assistant:

ps_config_t *
cmd_ln_parse_file_r(ps_config_t *inout_cmdln, const ps_arg_t * defn, const char *filename, int32 strict)
{
    FILE *file;
    int argc;
    int argv_size;
    char *str;
    int arg_max_length = 512;
    int len = 0;
    int quoting, ch;
    char **f_argv;
    int rv = 0;
    const char separator[] = " \t\r\n";

    if ((file = fopen(filename, "r")) == NULL) {
        E_ERROR("Cannot open configuration file %s for reading\n",
                filename);
        return NULL;
    }

    ch = fgetc(file);
    /* Skip to the next interesting character */
    for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

    if (ch == EOF) {
        fclose(file);
        return NULL;
    }

    /*
     * Initialize default argv, argc, and argv_size.
     */
    argv_size = 30;
    argc = 0;
    f_argv = (char **)ckd_calloc(argv_size, sizeof(char *));
    /* Silently make room for \0 */
    str = (char* )ckd_calloc(arg_max_length + 1, sizeof(char));
    quoting = 0;

    do {
        /* Handle arguments that are commented out */
        if (len == 0 && argc % 2 == 0) {
            while (ch == '#') {
                /* Skip everything until newline */
                for (ch = fgetc(file); ch != EOF && ch != '\n'; ch = fgetc(file)) ;
                /* Skip to the next interesting character */
                for (ch = fgetc(file); ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;
            }

            /* Check if we are at the last line (without anything interesting in it) */
            if (ch == EOF)
                break;
        }

        /* Handle quoted arguments */
        if (ch == '"' || ch == '\'') {
            if (quoting == ch) /* End a quoted section with the same type */
                quoting = 0;
            else if (quoting) {
                E_ERROR("Nesting quotations is not supported!\n");
                rv = 1;
                break;
            }
            else
                quoting = ch; /* Start a quoted section */
        }
        else if (ch == EOF || (!quoting && strchr(separator, ch))) {
            /* Reallocate argv so it is big enough to contain all the arguments */
            if (argc >= argv_size) {
                char **tmp_argv;
                if (!(tmp_argv =
                       (char **)ckd_realloc(f_argv, argv_size * 2 * sizeof(char *)))) {
                    rv = 1;
                    break;
                }
                f_argv = tmp_argv;
                argv_size *= 2;
            }

            /* Add the string to the list of arguments */
            f_argv[argc] = ckd_salloc(str);
            len = 0;
            str[0] = '\0';
            argc++;

            if (quoting)
                E_WARN("Unclosed quotation, having EOF close it...\n");

            /* Skip to the next interesting character */
            for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

            if (ch == EOF)
                break;

            /* We already have the next character */
            continue;
        }
        else {
            if (len >= arg_max_length) {
                /* Make room for more chars (including the \0 !) */
                char *tmp_str = str;
                if ((tmp_str = (char *)ckd_realloc(str, (1 + arg_max_length * 2) * sizeof(char))) == NULL) {
                    rv = 1;
                    break;
                }
                str = tmp_str;
                arg_max_length *= 2;
            }
            /* Add the char to the argument string */
            str[len++] = ch;
            /* Always null terminate */
            str[len] = '\0';
        }

        ch = fgetc(file);
    } while (1);

    fclose(file);

    ckd_free(str);

    if (rv) {
        for (ch = 0; ch < argc; ++ch)
            ckd_free(f_argv[ch]);
        ckd_free(f_argv);
        return NULL;
    }

    return parse_options(inout_cmdln, defn, argc, f_argv, strict);
}